

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall cmLocalGenerator::GenerateTestFiles(cmLocalGenerator *this)

{
  Snapshot *this_00;
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  size_t sVar5;
  ulong uVar6;
  pointer ppcVar7;
  long lVar8;
  vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> children;
  string file;
  string outP;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  cmGeneratedFileStream fout;
  allocator local_341;
  undefined1 local_340 [16];
  cmLinkedTree<cmState::BuildsystemDirectoryStateType> local_330;
  long *local_300 [2];
  long local_2f0 [2];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  undefined1 local_278 [584];
  
  pcVar1 = this->Makefile;
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"CMAKE_TESTING_ENABLED","");
  bVar2 = cmMakefile::IsOn(pcVar1,(string *)local_278);
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  if (bVar2) {
    local_298.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_298.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_298.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmMakefile::GetConfigurations((string *)(local_2d0 + 0x18),this->Makefile,&local_298,false);
    this_00 = &this->StateSnapshot;
    cmState::Snapshot::GetDirectory((Directory *)local_278,this_00);
    pcVar3 = cmState::Directory::GetCurrentBinary((Directory *)local_278);
    std::__cxx11::string::string((string *)local_300,pcVar3,(allocator *)local_340);
    std::__cxx11::string::append((char *)local_300);
    std::__cxx11::string::append((char *)local_300);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_278,(char *)local_300[0],false);
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_278,true);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"# CMake generated Testfile for ",0x1f);
    std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18));
    std::ostream::put((char)local_278);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"# Source directory: ",0x14);
    cmState::Snapshot::GetDirectory((Directory *)local_340,this_00);
    pcVar3 = cmState::Directory::GetCurrentSource((Directory *)local_340);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"# Build directory: ",0x13);
    cmState::Snapshot::GetDirectory((Directory *)local_2e0,this_00);
    pcVar3 = cmState::Directory::GetCurrentBinary((Directory *)local_2e0);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
    }
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"# ",2);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"# This file includes the relevant testing commands ",0x33);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"required for ",0xd);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"# testing this directory and lists subdirectories to ",0x35);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"be tested as well.",0x12);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    pcVar1 = this->Makefile;
    local_340._0_8_ = &local_330;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"TEST_INCLUDE_FILE","");
    pcVar3 = cmMakefile::GetProperty(pcVar1,(string *)local_340);
    if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_340._0_8_ != &local_330) {
      operator_delete((void *)local_340._0_8_,
                      (ulong)((long)local_330.Data.
                                    super__Vector_base<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    if (pcVar3 != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"include(\"",9);
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar3,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\")",2);
      std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18));
      std::ostream::put((char)local_278);
      std::ostream::flush();
    }
    pcVar1 = this->Makefile;
    ppcVar7 = (pcVar1->TestGenerators).
              super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppcVar7 !=
        (pcVar1->TestGenerators).
        super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        cmTestGenerator::Compute(*ppcVar7,this);
        cmScriptGenerator::Generate
                  (&(*ppcVar7)->super_cmScriptGenerator,(ostream *)local_278,
                   (string *)(local_2d0 + 0x18),&local_298);
        ppcVar7 = ppcVar7 + 1;
      } while (ppcVar7 !=
               (pcVar1->TestGenerators).
               super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    cmMakefile::GetStateSnapshot(this->Makefile);
    cmState::Snapshot::GetChildren
              ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)
               &local_330.UpPositions,(Snapshot *)local_340);
    if (local_330.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_330.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      lVar8 = 0;
      uVar6 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"subdirs(",8);
        cmState::Snapshot::GetDirectory
                  ((Directory *)local_340,
                   (Snapshot *)
                   ((long)local_330.UpPositions.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar8));
        pcVar3 = cmState::Directory::GetCurrentBinary((Directory *)local_340);
        std::__cxx11::string::string((string *)local_2e0,pcVar3,&local_341);
        cmOutputConverter::Convert
                  ((string *)local_340,&this->super_cmOutputConverter,(string *)local_2e0,
                   START_OUTPUT,UNCHANGED);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,(char *)local_340._0_8_,local_340._8_8_);
        if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_340._0_8_ != &local_330) {
          operator_delete((void *)local_340._0_8_,
                          (ulong)((long)local_330.Data.
                                        super__Vector_base<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,")",1);
        std::ios::widen((char)*(undefined8 *)(local_278._0_8_ + -0x18) + (char)local_278);
        std::ostream::put((char)local_278);
        std::ostream::flush();
        if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_2e0._0_8_ !=
            (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_2d0) {
          operator_delete((void *)local_2e0._0_8_,(ulong)(local_2d0._0_8_ + 1));
        }
        uVar6 = uVar6 + 1;
        lVar8 = lVar8 + 0x18;
      } while (uVar6 < (ulong)(((long)local_330.UpPositions.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_330.UpPositions.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x5555555555555555));
    }
    if (local_330.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_330.UpPositions.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_330.UpPositions.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_330.UpPositions.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
    if (local_300[0] != local_2f0) {
      operator_delete(local_300[0],local_2f0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._24_8_ != &local_2a8) {
      operator_delete((void *)local_2d0._24_8_,local_2a8._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_298);
  }
  return;
}

Assistant:

void cmLocalGenerator::GenerateTestFiles()
{
  if ( !this->Makefile->IsOn("CMAKE_TESTING_ENABLED") )
    {
    return;
    }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes;
  const std::string& config =
    this->Makefile->GetConfigurations(configurationTypes, false);

  std::string file =
      this->StateSnapshot.GetDirectory().GetCurrentBinary();
  file += "/";
  file += "CTestTestfile.cmake";

  cmGeneratedFileStream fout(file.c_str());
  fout.SetCopyIfDifferent(true);

  fout << "# CMake generated Testfile for " << std::endl
       << "# Source directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource()
       << std::endl
       << "# Build directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentBinary()
       << std::endl
       << "# " << std::endl
       << "# This file includes the relevant testing commands "
       << "required for " << std::endl
       << "# testing this directory and lists subdirectories to "
       << "be tested as well." << std::endl;

  const char* testIncludeFile =
    this->Makefile->GetProperty("TEST_INCLUDE_FILE");
  if ( testIncludeFile )
    {
    fout << "include(\"" << testIncludeFile << "\")" << std::endl;
    }

  // Ask each test generator to write its code.
  std::vector<cmTestGenerator*> const&
    testers = this->Makefile->GetTestGenerators();
  for(std::vector<cmTestGenerator*>::const_iterator gi = testers.begin();
      gi != testers.end(); ++gi)
    {
    (*gi)->Compute(this);
    (*gi)->Generate(fout, config, configurationTypes);
    }
  size_t i;
  std::vector<cmState::Snapshot> children
      = this->Makefile->GetStateSnapshot().GetChildren();
  for(i = 0; i < children.size(); ++i)
    {
    // TODO: Use add_subdirectory instead?
    fout << "subdirs(";
    std::string outP = children[i].GetDirectory().GetCurrentBinary();
    fout << this->Convert(outP,START_OUTPUT);
    fout << ")" << std::endl;
    }
}